

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor_p.h
# Opt level: O0

bool __thiscall QTextCursorPrivate::setPosition(QTextCursorPrivate *this,int newPosition)

{
  bool bVar1;
  bool moved;
  int newPosition_local;
  QTextCursorPrivate *this_local;
  
  bVar1 = this->position != newPosition;
  if (bVar1) {
    this->position = newPosition;
    this->currentCharFormat = -1;
  }
  return bVar1;
}

Assistant:

inline bool setPosition(int newPosition) {
        Q_ASSERT(newPosition >= 0 && newPosition < priv->length());
        bool moved = position != newPosition;
        if (moved) {
            position = newPosition;
            currentCharFormat = -1;
        }
        return moved;
    }